

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexPage(Wal *pWal,int iPage,u32 **ppPage)

{
  void *pvVar1;
  sqlite3_file *in_RDX;
  int in_ESI;
  long in_RDI;
  u32 **apNew;
  int nByte;
  int rc;
  void **in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int iPage_00;
  
  iPage_00 = 0;
  if (*(int *)(in_RDI + 0x28) <= in_ESI) {
    in_stack_ffffffffffffffd8 = (in_ESI + 1) * 8;
    in_stack_ffffffffffffffd0 = sqlite3_realloc(in_stack_ffffffffffffffc8,0);
    if (in_stack_ffffffffffffffd0 == (void *)0x0) {
      in_RDX->pMethods = (sqlite3_io_methods *)0x0;
      return 7;
    }
    memset((void *)((long)in_stack_ffffffffffffffd0 + (long)*(int *)(in_RDI + 0x28) * 8),0,
           (long)((in_ESI + 1) - *(int *)(in_RDI + 0x28)) << 3);
    *(void **)(in_RDI + 0x30) = in_stack_ffffffffffffffd0;
    *(int *)(in_RDI + 0x28) = in_ESI + 1;
  }
  if (*(long *)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 8) == 0) {
    if (*(char *)(in_RDI + 0x3f) == '\x02') {
      pvVar1 = sqlite3MallocZero((u64)in_stack_ffffffffffffffd0);
      *(void **)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 8) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 8) == 0) {
        iPage_00 = 7;
      }
    }
    else {
      iPage_00 = sqlite3OsShmMap(in_RDX,iPage_00,in_stack_ffffffffffffffd8,
                                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                 in_stack_ffffffffffffffc8);
      if (iPage_00 == 8) {
        *(byte *)(in_RDI + 0x42) = *(byte *)(in_RDI + 0x42) | 2;
        iPage_00 = 0;
      }
    }
  }
  in_RDX->pMethods = *(sqlite3_io_methods **)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 8);
  return iPage_00;
}

Assistant:

static int walIndexPage(Wal *pWal, int iPage, volatile u32 **ppPage){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    int nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  if( pWal->apWiData[iPage]==0 ){
    if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
      pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
      if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
          pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
      );
      if( rc==SQLITE_READONLY ){
        pWal->readOnly |= WAL_SHM_RDONLY;
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}